

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_primary_rc_init(AV1EncoderConfig *oxcf,PRIMARY_RATE_CONTROL *p_rc)

{
  int iVar1;
  int height;
  long in_RSI;
  double *in_RDI;
  double dVar2;
  int i;
  int max_gf_interval;
  int min_gf_interval;
  int worst_allowed_q;
  RateControlCfg *rc_cfg;
  aom_bit_depth_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_28;
  int local_1c;
  
  local_1c = *(int *)(in_RDI + 0x16);
  iVar1 = *(int *)((long)in_RDI + 0x134);
  height = *(int *)(in_RDI + 0x27);
  if (iVar1 == 0) {
    iVar1 = av1_rc_get_default_min_gf_interval
                      (0,height,(double)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0
                                                ));
  }
  if (height == 0) {
    height = get_default_max_gf_interval(*in_RDI,iVar1);
  }
  *(int *)(in_RSI + 0x2130) = (iVar1 + height) / 2;
  *(undefined4 *)(in_RSI + 0x2138) = 0;
  *(undefined4 *)(in_RSI + 0x213c) = 0;
  *(undefined4 *)(in_RSI + 0x2178) = 0;
  *(undefined8 *)(in_RSI + 0x2180) = 0;
  *(undefined8 *)(in_RSI + 0x21f8) = 0;
  *(undefined8 *)(in_RSI + 0x2200) = 0;
  *(undefined8 *)(in_RSI + 0x2208) = *(undefined8 *)(in_RSI + 0x2140);
  if (*(byte *)((long)in_RDI + 0x414) < 0x1c) {
    local_1c = 0xff;
  }
  if ((*(int *)(in_RDI + 0x87) == 0) && (*(int *)((long)in_RDI + 0xbc) == 1)) {
    *(int *)(in_RSI + 0x218c) = local_1c;
    *(int *)(in_RSI + 0x2190) = local_1c;
  }
  else {
    *(int *)(in_RSI + 0x218c) = (local_1c + *(int *)((long)in_RDI + 0xb4)) / 2;
    *(int *)(in_RSI + 0x2190) = (local_1c + *(int *)((long)in_RDI + 0xb4)) / 2;
  }
  dVar2 = av1_convert_qindex_to_q(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  *(double *)(in_RSI + 0x21c0) = dVar2;
  *(undefined4 *)(in_RSI + 0x21c8) = *(undefined4 *)((long)in_RDI + 0xb4);
  *(undefined4 *)(in_RSI + 0x21cc) = *(undefined4 *)(in_RDI + 0x16);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    *(undefined8 *)(in_RSI + 0x21d8 + (long)local_28 * 8) = 0x3fe6666666666666;
  }
  *(undefined8 *)(in_RSI + 0x21f0) = 0x3ff0000000000000;
  *(undefined8 *)(in_RSI + 0x2228) = *(undefined8 *)(in_RSI + 0x2140);
  if ((int)((double)(long)in_RDI[0x11] / *in_RDI) < 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = (int)((double)(long)in_RDI[0x11] / *in_RDI);
  }
  *(int *)(in_RSI + 0x2230) = iVar1;
  if ((int)((double)(long)in_RDI[0x11] / *in_RDI) < 1) {
    iVar1 = 1;
  }
  else {
    iVar1 = (int)((double)(long)in_RDI[0x11] / *in_RDI);
  }
  *(int *)(in_RSI + 0x2234) = iVar1;
  return;
}

Assistant:

void av1_primary_rc_init(const AV1EncoderConfig *oxcf,
                         PRIMARY_RATE_CONTROL *p_rc) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  int worst_allowed_q = rc_cfg->worst_allowed_q;

  int min_gf_interval = oxcf->gf_cfg.min_gf_interval;
  int max_gf_interval = oxcf->gf_cfg.max_gf_interval;
  if (min_gf_interval == 0)
    min_gf_interval = av1_rc_get_default_min_gf_interval(
        oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height,
        oxcf->input_cfg.init_framerate);
  if (max_gf_interval == 0)
    max_gf_interval = get_default_max_gf_interval(
        oxcf->input_cfg.init_framerate, min_gf_interval);
  p_rc->baseline_gf_interval = (min_gf_interval + max_gf_interval) / 2;
  p_rc->this_key_frame_forced = 0;
  p_rc->next_key_frame_forced = 0;
  p_rc->ni_frames = 0;

  p_rc->tot_q = 0.0;
  p_rc->total_actual_bits = 0;
  p_rc->total_target_bits = 0;
  p_rc->buffer_level = p_rc->starting_buffer_level;

  if (oxcf->target_seq_level_idx[0] < SEQ_LEVELS) {
    worst_allowed_q = 255;
  }
  if (oxcf->pass == AOM_RC_ONE_PASS && rc_cfg->mode == AOM_CBR) {
    p_rc->avg_frame_qindex[KEY_FRAME] = worst_allowed_q;
    p_rc->avg_frame_qindex[INTER_FRAME] = worst_allowed_q;
  } else {
    p_rc->avg_frame_qindex[KEY_FRAME] =
        (worst_allowed_q + rc_cfg->best_allowed_q) / 2;
    p_rc->avg_frame_qindex[INTER_FRAME] =
        (worst_allowed_q + rc_cfg->best_allowed_q) / 2;
  }
  p_rc->avg_q = av1_convert_qindex_to_q(rc_cfg->worst_allowed_q,
                                        oxcf->tool_cfg.bit_depth);
  p_rc->last_q[KEY_FRAME] = rc_cfg->best_allowed_q;
  p_rc->last_q[INTER_FRAME] = rc_cfg->worst_allowed_q;

  for (int i = 0; i < RATE_FACTOR_LEVELS; ++i) {
    p_rc->rate_correction_factors[i] = 0.7;
  }
  p_rc->rate_correction_factors[KF_STD] = 1.0;
  p_rc->bits_off_target = p_rc->starting_buffer_level;

  p_rc->rolling_target_bits = AOMMAX(
      1, (int)(oxcf->rc_cfg.target_bandwidth / oxcf->input_cfg.init_framerate));
  p_rc->rolling_actual_bits = AOMMAX(
      1, (int)(oxcf->rc_cfg.target_bandwidth / oxcf->input_cfg.init_framerate));
}